

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O2

Index __thiscall wasm::Pusher::optimizeSegment(Pusher *this,Index firstPushable,Index pushPoint)

{
  size_t sVar1;
  Expression *pEVar2;
  bool bVar3;
  Expression **ppEVar4;
  EffectAnalyzer *other;
  ulong uVar5;
  ulong index;
  Index IVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 local_1e0 [8];
  EffectAnalyzer cumulativeEffects;
  LocalSet *pushable;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> toPush;
  uint local_40;
  
  if ((pushPoint <= firstPushable) || (pushPoint == 0xffffffff)) {
    __assert_fail("firstPushable != Index(-1) && pushPoint != Index(-1) && firstPushable < pushPoint"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CodePushing.cpp"
                  ,0xb6,"Index wasm::Pusher::optimizeSegment(Index, Index)");
  }
  EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)local_1e0,this->passOptions,this->module);
  index = (ulong)pushPoint;
  ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                      (&this->list->
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                       index);
  EffectAnalyzer::walk((EffectAnalyzer *)local_1e0,*ppEVar4);
  EffectAnalyzer::ignoreControlFlowTransfers((EffectAnalyzer *)local_1e0);
  pushable = (LocalSet *)0x0;
  toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar9 = index;
  while( true ) {
    sVar1 = uVar9 - 1;
    ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&this->list->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,sVar1);
    cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)isPushable(this,*ppEVar4);
    if ((LocalSet *)
        cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (LocalSet *)0x0) {
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this->list->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,sVar1);
      EffectAnalyzer::walk((EffectAnalyzer *)local_1e0,*ppEVar4);
    }
    else {
      other = getPushableEffects(this,(LocalSet *)
                                      cumulativeEffects.delegateTargets._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count);
      bVar3 = EffectAnalyzer::invalidates((EffectAnalyzer *)local_1e0,other);
      if (bVar3) {
        EffectAnalyzer::mergeIn((EffectAnalyzer *)local_1e0,other);
      }
      else {
        std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::push_back
                  ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)&pushable,
                   (value_type *)
                   &cumulativeEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count);
      }
    }
    if (sVar1 == firstPushable) break;
    uVar9 = sVar1;
    if (sVar1 == 0) {
      __assert_fail("i > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CodePushing.cpp"
                    ,0xde,"Index wasm::Pusher::optimizeSegment(Index, Index)");
    }
  }
  if ((long)toPush.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
            super__Vector_impl_data._M_start - (long)pushable != 0) {
    uVar5 = (ulong)((long)toPush.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_start - (long)pushable) >> 3;
    uVar8 = 0;
    lVar7 = -1;
    while( true ) {
      sVar1 = uVar9 + lVar7;
      local_40 = (uint)uVar5;
      if (index < sVar1) break;
      if ((uVar8 < local_40) &&
         (ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&this->list->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,sVar1),
         *ppEVar4 ==
         *(Expression **)
          (&(pushable->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id +
          (ulong)(~uVar8 + local_40) * 2))) {
        uVar8 = uVar8 + 1;
      }
      else if (uVar8 == 0) {
        uVar8 = 0;
      }
      else {
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this->list->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,sVar1);
        pEVar2 = *ppEVar4;
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this->list->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(ulong)(((int)uVar9 + (int)lVar7) - uVar8));
        *ppEVar4 = pEVar2;
      }
      lVar7 = lVar7 + 1;
    }
    if (uVar8 != local_40) {
      __assert_fail("skip == total",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CodePushing.cpp"
                    ,0xf4,"Index wasm::Pusher::optimizeSegment(Index, Index)");
    }
    IVar6 = pushPoint;
    for (uVar9 = 0; (uVar5 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
      pEVar2 = *(Expression **)
                (&(pushable->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id
                + uVar9 * 2);
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this->list->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)IVar6);
      *ppEVar4 = pEVar2;
      IVar6 = IVar6 - 1;
    }
    pushPoint = pushPoint - local_40;
  }
  std::_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::~_Vector_base
            ((_Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)&pushable);
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_1e0);
  return pushPoint + 1;
}

Assistant:

Index optimizeSegment(Index firstPushable, Index pushPoint) {
    // The interesting part. Starting at firstPushable, try to push
    // code past pushPoint. We start at the end since we are pushing
    // forward, that way we can push later things out of the way
    // of earlier ones. Once we know all we can push, we push it all
    // in one pass, keeping the order of the pushables intact.
    assert(firstPushable != Index(-1) && pushPoint != Index(-1) &&
           firstPushable < pushPoint);
    // everything that matters if you want to be pushed past the pushPoint
    EffectAnalyzer cumulativeEffects(passOptions, module);
    cumulativeEffects.walk(list[pushPoint]);
    // It is ok to ignore branching out of the block here, that is the crucial
    // point of this optimization. That is, we are in a situation like this:
    //
    // {
    //   x = value;
    //   if (..) break;
    //   foo(x);
    // }
    //
    // If the branch is taken, then that's fine, it will jump out of this block
    // and reach some outer scope, and in that case we never need x at all
    // (since we've proven before that x is not used outside of this block, see
    // numGetsSoFar which we use for that). Similarly, control flow could
    // transfer away via a return or an exception and that would be ok as well.
    cumulativeEffects.ignoreControlFlowTransfers();
    std::vector<LocalSet*> toPush;
    Index i = pushPoint - 1;
    while (1) {
      auto* pushable = isPushable(list[i]);
      if (pushable) {
        const auto& effects = getPushableEffects(pushable);
        if (cumulativeEffects.invalidates(effects)) {
          // we can't push this, so further pushables must pass it
          cumulativeEffects.mergeIn(effects);
        } else {
          // we can push this, great!
          toPush.push_back(pushable);
        }
      } else {
        // something that can't be pushed, so it might block further pushing
        cumulativeEffects.walk(list[i]);
      }
      if (i == firstPushable) {
        // no point in looking further
        break;
      }
      assert(i > 0);
      i--;
    }
    if (toPush.size() == 0) {
      // nothing to do, can only continue after the push point
      return pushPoint + 1;
    }
    // we have work to do!
    Index total = toPush.size();
    Index last = total - 1;
    Index skip = 0;
    for (Index i = firstPushable; i <= pushPoint; i++) {
      // we see the first elements at the end of toPush
      if (skip < total && list[i] == toPush[last - skip]) {
        // this is one of our elements to push, skip it
        skip++;
      } else {
        if (skip) {
          list[i - skip] = list[i];
        }
      }
    }
    assert(skip == total);
    // write out the skipped elements
    for (Index i = 0; i < total; i++) {
      list[pushPoint - i] = toPush[i];
    }
    // proceed right after the push point, we may push the pushed elements again
    return pushPoint - total + 1;
  }